

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardVariableSpecification.cpp
# Opt level: O1

bool __thiscall
DIS::StandardVariableSpecification::operator==
          (StandardVariableSpecification *this,StandardVariableSpecification *rhs)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  pointer pSVar4;
  ulong uVar5;
  
  pSVar4 = (this->_standardVariables).
           super__Vector_base<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_standardVariables).
      super__Vector_base<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
      ._M_impl.super__Vector_impl_data._M_finish == pSVar4) {
    bVar2 = true;
  }
  else {
    bVar2 = true;
    lVar3 = 0;
    uVar5 = 0;
    do {
      bVar1 = SimulationManagementPduHeader::operator==
                        ((SimulationManagementPduHeader *)
                         ((long)&pSVar4->_vptr_SimulationManagementPduHeader + lVar3),
                         (SimulationManagementPduHeader *)
                         ((long)&((rhs->_standardVariables).
                                  super__Vector_base<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                 _vptr_SimulationManagementPduHeader + lVar3));
      if (!bVar1) {
        bVar2 = false;
      }
      uVar5 = uVar5 + 1;
      pSVar4 = (this->_standardVariables).
               super__Vector_base<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x60;
    } while (uVar5 < (ulong)(((long)(this->_standardVariables).
                                    super__Vector_base<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar4 >> 5)
                            * -0x5555555555555555));
  }
  return bVar2;
}

Assistant:

bool StandardVariableSpecification::operator ==(const StandardVariableSpecification& rhs) const
 {
     bool ivarsEqual = true;


     for(size_t idx = 0; idx < _standardVariables.size(); idx++)
     {
        if( ! ( _standardVariables[idx] == rhs._standardVariables[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }